

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdD3D56Config::adjust_orig_mthd(MthdD3D56Config *this)

{
  result_type rVar1;
  MthdD3D56Config *this_local;
  
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest
                        .super_Test.rnd);
  if ((rVar1 & 1) != 0) {
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                          super_RepeatTest.super_Test.rnd);
    if ((rVar1 & 3) != 0) {
      (this->super_SingleMthdTest).super_MthdTest.val =
           (this->super_SingleMthdTest).super_MthdTest.val & 0xfffff0ff | 0x100;
    }
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                          super_RepeatTest.super_Test.rnd);
    if ((rVar1 & 3) != 0) {
      (this->super_SingleMthdTest).super_MthdTest.val =
           (this->super_SingleMthdTest).super_MthdTest.val & 0xffff7fff;
    }
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                          super_RepeatTest.super_Test.rnd);
    if ((rVar1 & 3) != 0) {
      (this->super_SingleMthdTest).super_MthdTest.val =
           (this->super_SingleMthdTest).super_MthdTest.val & 0xfff0ffff | 0x10000;
    }
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                          super_RepeatTest.super_Test.rnd);
    if ((rVar1 & 3) != 0) {
      (this->super_SingleMthdTest).super_MthdTest.val =
           (this->super_SingleMthdTest).super_MthdTest.val & 0xc1ffffff;
    }
  }
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (rnd() & 1) {
			if (rnd() & 3)
				insrt(val, 8, 4, 1);
			if (rnd() & 3)
				insrt(val, 15, 1, 0);
			if (rnd() & 3)
				insrt(val, 16, 4, 1);
			if (rnd() & 3)
				insrt(val, 25, 5, 0);
		}
	}